

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCore.c
# Opt level: O2

Vec_Int_t * Cnf_DeriveMappingArray(Aig_Man_t *pAig)

{
  Cnf_Man_t *p;
  abctime aVar1;
  Aig_MmFixed_t *p_00;
  abctime aVar2;
  Vec_Ptr_t *vMapped;
  Vec_Int_t *pVVar3;
  
  p = Cnf_ManStart();
  p->pManAig = pAig;
  aVar1 = Abc_Clock();
  p_00 = Dar_ManComputeCuts(pAig,10,0,0);
  aVar2 = Abc_Clock();
  p->timeCuts = aVar2 - aVar1;
  aVar1 = Abc_Clock();
  Cnf_DeriveMapping(p);
  aVar2 = Abc_Clock();
  p->timeMap = aVar2 - aVar1;
  aVar1 = Abc_Clock();
  Cnf_ManTransferCuts(p);
  vMapped = Cnf_ManScanMapping(p,1,0);
  pVVar3 = Cnf_ManWriteCnfMapping(p,vMapped);
  Vec_PtrFree(vMapped);
  Aig_MmFixedStop(p_00,0);
  aVar2 = Abc_Clock();
  p->timeSave = aVar2 - aVar1;
  Aig_ManResetRefs(pAig);
  Cnf_ManStop(p);
  return pVVar3;
}

Assistant:

Vec_Int_t * Cnf_DeriveMappingArray( Aig_Man_t * pAig )
{
    Vec_Int_t * vResult;
    Cnf_Man_t * p;
    Vec_Ptr_t * vMapped;
    Aig_MmFixed_t * pMemCuts;
    abctime clk;
    // allocate the CNF manager
    p = Cnf_ManStart();
    p->pManAig = pAig;

    // generate cuts for all nodes, assign cost, and find best cuts
clk = Abc_Clock();
    pMemCuts = Dar_ManComputeCuts( pAig, 10, 0, 0 );
p->timeCuts = Abc_Clock() - clk;

    // find the mapping
clk = Abc_Clock();
    Cnf_DeriveMapping( p );
p->timeMap = Abc_Clock() - clk;
//    Aig_ManScanMapping( p, 1 );

    // convert it into CNF
clk = Abc_Clock();
    Cnf_ManTransferCuts( p );
    vMapped = Cnf_ManScanMapping( p, 1, 0 );
    vResult = Cnf_ManWriteCnfMapping( p, vMapped );
    Vec_PtrFree( vMapped );
    Aig_MmFixedStop( pMemCuts, 0 );
p->timeSave = Abc_Clock() - clk;

   // reset reference counters
    Aig_ManResetRefs( pAig );
//ABC_PRT( "Cuts   ", p->timeCuts );
//ABC_PRT( "Map    ", p->timeMap  );
//ABC_PRT( "Saving ", p->timeSave );
    Cnf_ManStop( p );
    return vResult;
}